

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

void __thiscall pybind11::int_::int_(int_ *this,object *o)

{
  PyObject *pPVar1;
  error_already_set *this_00;
  
  pPVar1 = (o->super_handle).m_ptr;
  if ((pPVar1 == (PyObject *)0x0) || ((pPVar1->ob_type->tp_flags & 0x1000000) == 0)) {
    pPVar1 = (PyObject *)PyNumber_Long();
    (this->super_object).super_handle.m_ptr = pPVar1;
    if (pPVar1 == (PyObject *)0x0) {
      this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this_00);
      __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    (this->super_object).super_handle.m_ptr = pPVar1;
  }
  return;
}

Assistant:

int_() : object(PyLong_FromLong(0), stolen_t{}) { }